

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTransport.h
# Opt level: O2

int __thiscall
duckdb_apache::thrift::transport::TTransport::open(TTransport *this,char *__file,int __oflag,...)

{
  TTransportException *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (TTransportException *)__cxa_allocate_exception(0x30,__file,___oflag);
  std::__cxx11::string::string((string *)&local_38,"Cannot open base TTransport.",&local_39);
  TTransportException::TTransportException(this_00,NOT_OPEN,&local_38);
  __cxa_throw(this_00,&TTransportException::typeinfo,TException::~TException);
}

Assistant:

virtual void open() {
    throw TTransportException(TTransportException::NOT_OPEN, "Cannot open base TTransport.");
  }